

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  Data *this_00;
  int dx1_00;
  ostream *poVar1;
  ArgExc *pAVar2;
  int dy1_00;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  this_00 = (this->_data).
            super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_00->frameBufferValid == false) {
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar2,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (((-1 < (ly | lx)) &&
      (((lx == ly || (this_00->tile_level_mode != EXR_TILE_MIPMAP_LEVELS)) &&
       (lx < this_00->num_x_levels)))) && (ly < this_00->num_y_levels)) {
    dx1_00 = dx2;
    if (dx1 < dx2) {
      dx1_00 = dx1;
    }
    if (dx2 < dx1) {
      dx2 = dx1;
    }
    dy1_00 = dy2;
    if (dy1 < dy2) {
      dy1_00 = dy1;
    }
    if (dy2 < dy1) {
      dy2 = dy1;
    }
    Data::readTiles(this_00,dx1_00,dx2,dy1_00,dy2,lx,ly,true);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Level coordinate (",0x12);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,lx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ly);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") is invalid.",0xd);
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar2,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //
    try
    {
        if (!_data->frameBufferValid)
        {
            throw IEX_NAMESPACE::ArgExc (
                "readPixelSampleCounts called with no valid frame buffer");
        }

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        if (dx1 > dx2) std::swap (dx1, dx2);
        if (dy1 > dy2) std::swap (dy1, dy2);

        _data->readTiles (dx1, dx2, dy1, dy2, lx, ly, true);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading deep pixel sample counts data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}